

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<long_double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  complex<long_double> *pcVar4;
  int64_t k;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble lVar10;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  long local_160;
  complex<long_double> __r_1;
  complex<long_double> __r_2;
  complex<long_double> __r;
  complex<long_double> local_b8;
  complex<long_double> tmp;
  undefined1 local_78 [32];
  complex<long_double> local_58;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar7 = (longdouble)1e-12;
    lVar9 = in_ST6;
    for (local_160 = 0; local_160 < CONCAT44(extraout_var,iVar3); local_160 = local_160 + 1) {
      lVar8 = in_ST1;
      in_ST1 = in_ST3;
      in_ST3 = in_ST5;
      in_ST5 = lVar9;
      for (lVar5 = 0; lVar6 = local_160, lVar5 < local_160; lVar5 = lVar5 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp,this,local_160,local_160);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&__r_2,this,local_160,lVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_b8,this,local_160,lVar5);
        __r._M_value._16_4_ = __r_2._M_value._16_4_;
        __r._M_value._20_4_ = __r_2._M_value._20_4_;
        __r._M_value._24_2_ = __r_2._M_value._24_2_;
        __r._M_value._26_2_ = __r_2._M_value._26_2_;
        __r._M_value._28_4_ = __r_2._M_value._28_4_;
        __r._M_value._0_4_ = __r_2._M_value._0_4_;
        __r._M_value._4_4_ = __r_2._M_value._4_4_;
        __r._M_value._8_2_ = __r_2._M_value._8_2_;
        __r._M_value._10_2_ = __r_2._M_value._10_2_;
        __r._M_value._12_4_ = __r_2._M_value._12_4_;
        std::complex<long_double>::operator*=(&__r,&local_b8);
        __r_1._M_value._8_2_ = tmp._M_value._8_2_;
        __r_1._M_value._10_2_ = tmp._M_value._10_2_;
        __r_1._M_value._12_4_ = tmp._M_value._12_4_;
        __r_1._M_value._24_2_ = tmp._M_value._24_2_;
        __r_1._M_value._26_2_ = tmp._M_value._26_2_;
        __r_1._M_value._28_4_ = tmp._M_value._28_4_;
        lVar10 = (longdouble)
                 CONCAT28(__r_1._M_value._8_2_,CONCAT44(tmp._M_value._4_4_,tmp._M_value._0_4_)) -
                 (longdouble)
                 CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
        lVar9 = (longdouble)
                CONCAT28(__r_1._M_value._24_2_,CONCAT44(tmp._M_value._20_4_,tmp._M_value._16_4_)) -
                (longdouble)
                CONCAT28(__r._M_value._24_2_,CONCAT44(__r._M_value._20_4_,__r._M_value._16_4_));
        __r_1._M_value._0_4_ = SUB104(lVar10,0);
        __r_1._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
        __r_1._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
        __r_1._M_value._16_4_ = SUB104(lVar9,0);
        __r_1._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
        __r_1._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
        in_ST3 = in_ST4;
        in_ST6 = in_ST4;
        in_ST5 = in_ST4;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar6,&__r_1);
      }
      pcVar4 = (complex<long_double> *)this;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (local_78,this,local_160,local_160);
      __r_1._M_value._16_4_ = SUB84(local_78._16_8_,0);
      __r_1._M_value._20_4_ = SUB84(local_78._16_8_,4);
      __r_1._M_value._24_2_ = SUB82(local_78._24_8_,0);
      __r_1._M_value._26_2_ = SUB82(local_78._24_8_,2);
      __r_1._M_value._28_4_ = SUB84(local_78._24_8_,4);
      __r_1._M_value._0_4_ = SUB84(local_78._0_8_,0);
      __r_1._M_value._4_4_ = SUB84(local_78._0_8_,4);
      __r_1._M_value._8_2_ = SUB82(local_78._8_8_,0);
      __r_1._M_value._10_2_ = SUB82(local_78._8_8_,2);
      __r_1._M_value._12_4_ = SUB84(local_78._8_8_,4);
      std::abs<long_double>((longdouble *)&__r_1,pcVar4);
      lVar10 = ABS(in_ST0);
      __r_1._M_value._0_4_ = SUB104(lVar7,0);
      __r_1._M_value._4_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
      __r_1._M_value._8_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
      lVar9 = (longdouble)0;
      __r_1._M_value._16_4_ = SUB104(lVar9,0);
      __r_1._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
      __r_1._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = in_ST6;
      std::abs<long_double>((longdouble *)&__r_1,pcVar4);
      in_ST6 = in_ST5;
      lVar9 = in_ST5;
      if (lVar10 <= ABS(lVar8)) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back(singular,&local_160);
        lVar9 = (longdouble)1;
        __r_1._M_value._0_4_ = SUB104(lVar9,0);
        __r_1._M_value._4_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
        __r_1._M_value._8_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
        lVar9 = (longdouble)0;
        __r_1._M_value._16_4_ = SUB104(lVar9,0);
        __r_1._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
        __r_1._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
        lVar9 = in_ST6;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_160,local_160,&__r_1);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&__r_1,this,local_160);
      std::sqrt<long_double>(&tmp,&__r_1);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,local_160,local_160,&tmp);
      lVar5 = local_160;
      while (lVar5 = lVar5 + 1, lVar5 < CONCAT44(extraout_var,iVar3)) {
        lVar8 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        for (lVar6 = 0; lVar1 = local_160, lVar6 < local_160; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&__r,this,local_160,lVar5);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_b8,this,local_160,lVar6);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,lVar6,lVar5);
          __r_2._M_value._16_8_ = local_b8._M_value._16_8_;
          __r_2._M_value._24_2_ = local_b8._M_value._24_2_;
          __r_2._M_value._26_6_ = local_b8._M_value._26_6_;
          __r_2._M_value._0_8_ = local_b8._M_value._0_8_;
          __r_2._M_value._8_2_ = local_b8._M_value._8_2_;
          __r_2._M_value._10_6_ = local_b8._M_value._10_6_;
          std::complex<long_double>::operator*=(&__r_2,&local_58);
          __r_1._M_value._10_2_ = __r._M_value._10_2_;
          __r_1._M_value._12_4_ = __r._M_value._12_4_;
          __r_1._M_value._26_2_ = __r._M_value._26_2_;
          __r_1._M_value._28_4_ = __r._M_value._28_4_;
          lVar10 = (longdouble)
                   CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_)) -
                   (longdouble)CONCAT28(__r_2._M_value._8_2_,__r_2._M_value._0_8_);
          lVar9 = (longdouble)
                  CONCAT28(__r._M_value._24_2_,CONCAT44(__r._M_value._20_4_,__r._M_value._16_4_)) -
                  (longdouble)CONCAT28(__r_2._M_value._24_2_,__r_2._M_value._16_8_);
          __r_1._M_value._0_4_ = SUB104(lVar10,0);
          __r_1._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
          __r_1._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
          __r_1._M_value._16_4_ = SUB104(lVar9,0);
          __r_1._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
          __r_1._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
          in_ST4 = in_ST3;
          in_ST5 = in_ST3;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar1,lVar5,&__r_1);
        }
        pcVar4 = (complex<long_double> *)this;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&__r,this,local_160,local_160);
        __r_1._M_value._16_4_ = __r._M_value._16_4_;
        __r_1._M_value._20_4_ = __r._M_value._20_4_;
        __r_1._M_value._24_2_ = __r._M_value._24_2_;
        __r_1._M_value._26_2_ = __r._M_value._26_2_;
        __r_1._M_value._28_4_ = __r._M_value._28_4_;
        __r_1._M_value._0_4_ = __r._M_value._0_4_;
        __r_1._M_value._4_4_ = __r._M_value._4_4_;
        __r_1._M_value._8_2_ = __r._M_value._8_2_;
        __r_1._M_value._10_2_ = __r._M_value._10_2_;
        __r_1._M_value._12_4_ = __r._M_value._12_4_;
        std::abs<long_double>((longdouble *)&__r_1,pcVar4);
        in_ST6 = in_ST5;
        lVar9 = in_ST5;
        if (ABS(lVar8) < (longdouble)1e-16) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        lVar6 = local_160;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&__r_2,this,local_160,lVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_b8,this,local_160);
        __r_1._M_value._16_4_ = __r_2._M_value._16_4_;
        __r_1._M_value._20_4_ = __r_2._M_value._20_4_;
        __r_1._M_value._24_2_ = __r_2._M_value._24_2_;
        __r_1._M_value._26_2_ = __r_2._M_value._26_2_;
        __r_1._M_value._28_4_ = __r_2._M_value._28_4_;
        __r_1._M_value._0_4_ = __r_2._M_value._0_4_;
        __r_1._M_value._4_4_ = __r_2._M_value._4_4_;
        __r_1._M_value._8_2_ = __r_2._M_value._8_2_;
        __r_1._M_value._10_2_ = __r_2._M_value._10_2_;
        __r_1._M_value._12_4_ = __r_2._M_value._12_4_;
        std::complex<long_double>::operator/=(&__r_1,&local_b8);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar5,&__r_1);
        lVar6 = local_160;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&__r_1,this,local_160,lVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar6,&__r_1);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}